

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_PlayerAmmo(FParser *this)

{
  bool bVar1;
  int iVar2;
  PClassAmmo *type;
  AInventory *pAVar3;
  AInventory *iammo;
  AInventory *iammo_1;
  PClassAmmo *ammotype;
  int amount;
  int playernum;
  FParser *this_local;
  
  bVar1 = CheckArgs(this,2);
  if (((bVar1) && (iVar2 = T_GetPlayerNum(this->t_argv), iVar2 != -1)) &&
     (type = T_GetAmmo(this->t_argv + 1), type != (PClassAmmo *)0x0)) {
    if (2 < this->t_argc) {
      pAVar3 = AActor::FindInventory
                         ((AActor *)(&players)[(long)iVar2 * 0x54],(PClassActor *)type,false);
      ammotype._0_4_ = intvalue(this->t_argv + 2);
      if ((int)ammotype < 0) {
        ammotype._0_4_ = 0;
      }
      if (pAVar3 == (AInventory *)0x0) {
        AActor::GiveAmmo((AActor *)(&players)[(long)iVar2 * 0x54],type,(int)ammotype);
      }
      else {
        pAVar3->Amount = (int)ammotype;
      }
    }
    (this->t_return).type = 1;
    pAVar3 = AActor::FindInventory
                       ((AActor *)(&players)[(long)iVar2 * 0x54],(PClassActor *)type,false);
    if (pAVar3 == (AInventory *)0x0) {
      (this->t_return).value.i = 0;
    }
    else {
      (this->t_return).value.i = pAVar3->Amount;
    }
  }
  return;
}

Assistant:

void FParser::SF_PlayerAmmo(void)
{
	int playernum, amount;
	PClassAmmo * ammotype;
	
	if (CheckArgs(2))
	{
		playernum=T_GetPlayerNum(t_argv[0]);
		if (playernum==-1) return;

		ammotype=T_GetAmmo(t_argv[1]);
		if (!ammotype) return;

		if(t_argc >= 3)
		{
			AInventory * iammo = players[playernum].mo->FindInventory(ammotype);
			amount = intvalue(t_argv[2]);
			if(amount < 0) amount = 0;
			if (iammo) iammo->Amount = amount;
			else players[playernum].mo->GiveAmmo(ammotype, amount);
		}

		t_return.type = svt_int;
		AInventory * iammo = players[playernum].mo->FindInventory(ammotype);
		if (iammo) t_return.value.i = iammo->Amount;
		else t_return.value.i = 0;
	}
}